

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

int32_t decUnitCompare(uint8_t *a,int32_t alength,uint8_t *b,int32_t blength,int32_t exp)

{
  uint uVar1;
  uint8_t *buffer;
  byte *pbVar2;
  long lVar3;
  byte *pbVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint8_t *c;
  uint8_t *puVar7;
  uint8_t accbuff [73];
  uint8_t local_88 [88];
  
  if (exp == 0) {
    uVar6 = 1;
    if (alength <= blength) {
      if (blength <= alength) {
        pbVar2 = a + (uint)alength;
        pbVar4 = b + (uint)alength;
        do {
          pbVar4 = pbVar4 + -1;
          pbVar2 = pbVar2 + -1;
          if (pbVar2 < a) {
            return 0;
          }
          if (*pbVar4 < *pbVar2) {
            return 1;
          }
        } while (*pbVar4 <= *pbVar2);
      }
      uVar6 = 0xffffffff;
    }
  }
  else {
    uVar1 = exp;
    if (exp < 0x32) {
      uVar1 = (uint)""[exp];
    }
    uVar6 = 1;
    if (alength <= (int)(uVar1 + blength)) {
      uVar1 = exp;
      if (exp < 0x32) {
        uVar1 = (uint)""[exp];
      }
      uVar6 = 0xffffffff;
      if ((int)(uVar1 + blength) <= alength + 1) {
        uVar6 = exp;
        if (exp < 0x32) {
          uVar6 = (uint)""[exp];
        }
        uVar1 = uVar6 + blength;
        if ((int)(uVar6 + blength) <= alength) {
          uVar1 = alength;
        }
        if (uVar1 < 0x48) {
          c = local_88;
          buffer = (uint8_t *)0x0;
        }
        else {
          buffer = (uint8_t *)uprv_malloc_63((ulong)(uVar1 + 2));
          c = buffer;
          if (buffer == (uint8_t *)0x0) {
            return -0x80000000;
          }
        }
        uVar6 = decUnitAddSub(a,alength,b,blength,exp,c,-1);
        if ((int)uVar6 < 0) {
          uVar6 = 0xffffffff;
        }
        else {
          puVar5 = c + ((ulong)uVar6 - 1);
          puVar7 = c;
          if (c < puVar5) {
            lVar3 = (ulong)uVar6 - 1;
            do {
              puVar7 = c;
              if (*c != '\0') break;
              c = c + 1;
              lVar3 = lVar3 + -1;
              puVar7 = puVar5;
            } while (lVar3 != 0);
          }
          uVar6 = (uint)(*puVar7 != '\0');
        }
        if (buffer != (uint8_t *)0x0) {
          uprv_free_63(buffer);
        }
      }
    }
  }
  return uVar6;
}

Assistant:

static Int decUnitCompare(const Unit *a, Int alength,
                          const Unit *b, Int blength, Int exp) {
  Unit  *acc;                      /* accumulator for result  */
  Unit  accbuff[SD2U(DECBUFFER*2+1)]; /* local buffer  */
  Unit  *allocacc=NULL;            /* -> allocated acc buffer, iff allocated  */
  Int   accunits, need;            /* units in use or needed for acc  */
  const Unit *l, *r, *u;           /* work  */
  Int   expunits, exprem, result;  /* ..  */

  if (exp==0) {                    /* aligned; fastpath  */
    if (alength>blength) return 1;
    if (alength<blength) return -1;
    /* same number of units in both -- need unit-by-unit compare  */
    l=a+alength-1;
    r=b+alength-1;
    for (;l>=a; l--, r--) {
      if (*l>*r) return 1;
      if (*l<*r) return -1;
      }
    return 0;                      /* all units match  */
    } /* aligned  */

  /* Unaligned.  If one is >1 unit longer than the other, padded  */
  /* approximately, then can return easily  */
  if (alength>blength+(Int)D2U(exp)) return 1;
  if (alength+1<blength+(Int)D2U(exp)) return -1;

  /* Need to do a real subtract.  For this, a result buffer is needed  */
  /* even though only the sign is of interest.  Its length needs  */
  /* to be the larger of alength and padded blength, +2  */
  need=blength+D2U(exp);                /* maximum real length of B  */
  if (need<alength) need=alength;
  need+=2;
  acc=accbuff;                          /* assume use local buffer  */
  if (need*sizeof(Unit)>sizeof(accbuff)) {
    allocacc=(Unit *)malloc(need*sizeof(Unit));
    if (allocacc==NULL) return BADINT;  /* hopeless -- abandon  */
    acc=allocacc;
    }
  /* Calculate units and remainder from exponent.  */
  expunits=exp/DECDPUN;
  exprem=exp%DECDPUN;
  /* subtract [A+B*(-m)]  */
  accunits=decUnitAddSub(a, alength, b, blength, expunits, acc,
                         -(Int)powers[exprem]);
  /* [UnitAddSub result may have leading zeros, even on zero]  */
  if (accunits<0) result=-1;            /* negative result  */
   else {                               /* non-negative result  */
    /* check units of the result before freeing any storage  */
    for (u=acc; u<acc+accunits-1 && *u==0;) u++;
    result=(*u==0 ? 0 : +1);
    }
  /* clean up and return the result  */
  if (allocacc!=NULL) free(allocacc);   /* drop any storage used  */
  return result;
  }